

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlBufferPtr xmlBufferCreate(void)

{
  xmlBufferPtr pxVar1;
  uint *puVar2;
  xmlBufferAllocationScheme *pxVar3;
  xmlChar *pxVar4;
  
  pxVar1 = (xmlBufferPtr)(*xmlMalloc)(0x20);
  if (pxVar1 == (xmlBufferPtr)0x0) {
    xmlTreeErrMemory("creating buffer");
  }
  else {
    pxVar1->use = 0;
    puVar2 = (uint *)__xmlDefaultBufferSize();
    pxVar1->size = *puVar2;
    pxVar3 = __xmlBufferAllocScheme();
    pxVar1->alloc = *pxVar3;
    pxVar4 = (xmlChar *)(*xmlMallocAtomic)((size_t)pxVar1->size);
    pxVar1->content = pxVar4;
    if (pxVar4 != (xmlChar *)0x0) {
      *pxVar4 = '\0';
      pxVar1->contentIO = (xmlChar *)0x0;
      return pxVar1;
    }
    xmlTreeErrMemory("creating buffer");
    (*xmlFree)(pxVar1);
  }
  return (xmlBufferPtr)0x0;
}

Assistant:

xmlBufferPtr
xmlBufferCreate(void) {
    xmlBufferPtr ret;

    ret = (xmlBufferPtr) xmlMalloc(sizeof(xmlBuffer));
    if (ret == NULL) {
	xmlTreeErrMemory("creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->size = xmlDefaultBufferSize;
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
    if (ret->content == NULL) {
	xmlTreeErrMemory("creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}